

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void YM2608IRQMaskWrite(FM_OPN *OPN,YM2608 *F2608,int v)

{
  FM_IRQHANDLER UNRECOVERED_JUMPTABLE;
  byte bVar1;
  byte bVar2;
  
  OPN->type = (byte)v >> 5 & 4 | OPN->type & 0xfb;
  bVar2 = (byte)v & 0x1f;
  F2608->irqmask = bVar2;
  bVar2 = bVar2 & F2608->flagmask;
  (OPN->ST).irqmask = bVar2;
  bVar1 = (OPN->ST).status;
  if ((OPN->ST).irq == '\0') {
    if ((bVar1 & bVar2) == 0) {
      return;
    }
    (OPN->ST).irq = '\x01';
    UNRECOVERED_JUMPTABLE = (OPN->ST).IRQ_Handler;
    if (UNRECOVERED_JUMPTABLE != (FM_IRQHANDLER)0x0) {
      (*UNRECOVERED_JUMPTABLE)((OPN->ST).param,'\x01');
      if ((OPN->ST).irq == '\0') {
        return;
      }
      bVar2 = (OPN->ST).irqmask;
      bVar1 = (OPN->ST).status;
    }
  }
  if ((bVar1 & bVar2) == 0) {
    (OPN->ST).irq = '\0';
    UNRECOVERED_JUMPTABLE = (OPN->ST).IRQ_Handler;
    if (UNRECOVERED_JUMPTABLE != (FM_IRQHANDLER)0x0) {
      (*UNRECOVERED_JUMPTABLE)((OPN->ST).param,'\0');
      return;
    }
  }
  return;
}

Assistant:

INLINE void YM2608IRQMaskWrite(FM_OPN *OPN, YM2608 *F2608, int v)
{
	/* SCH,xx,xxx,EN_ZERO,EN_BRDY,EN_EOS,EN_TB,EN_TA */

	/* extend 3ch. enable/disable */
	if(v&0x80)
		OPN->type |= TYPE_6CH;  /* OPNA mode - 6 FM channels */
	else
		OPN->type &= ~TYPE_6CH; /* OPN mode - 3 FM channels */

	/* IRQ MASK store and set */
	F2608->irqmask = v&0x1f;
	FM_IRQMASK_SET(&OPN->ST, (F2608->irqmask & F2608->flagmask) );
}